

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_hamt_map.cpp
# Opt level: O2

void __thiscall
DefaultIndexFixture_UpsertInternalStore_Test::DefaultIndexFixture_UpsertInternalStore_Test
          (DefaultIndexFixture_UpsertInternalStore_Test *this)

{
  anon_unknown.dwarf_13be9a::DefaultIndexFixture::DefaultIndexFixture
            (&this->super_DefaultIndexFixture);
  (this->super_DefaultIndexFixture).super_IndexFixture.super_Test._vptr_Test =
       (_func_int **)&PTR__DefaultIndexFixture_00256a00;
  return;
}

Assistant:

TEST_F (DefaultIndexFixture, UpsertInternalStore) {
    transaction_type t1 = begin (db_, lock_guard{mutex_});
    std::pair<default_index::iterator, bool> itp1 =
        index_->insert_or_assign (t1, std::make_pair ("a"s, "b"s));
    std::pair<default_index::iterator, bool> itp2 =
        index_->insert_or_assign (t1, std::make_pair ("c"s, "d"s));

    std::string const & key1 = (*itp1.first).first;
    EXPECT_EQ ("a", key1);
    EXPECT_TRUE (itp1.second);
    std::string const & key2 = (*itp2.first).first;
    EXPECT_EQ ("c", key2);
    EXPECT_TRUE (itp2.second);

    index_->flush (t1, db_.get_current_revision ());

    std::pair<default_index::iterator, bool> itp3 =
        index_->insert_or_assign (t1, std::make_pair ("c"s, "f"s));
    std::string & value = (*itp3.first).second;
    EXPECT_EQ ("f", value);
    EXPECT_FALSE (itp3.second);
}